

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMcode curl_multi_perform(Curl_multi *multi,int *running_handles)

{
  curl_trc_feat *pcVar1;
  _Bool _Var2;
  CURLMcode CVar3;
  CURLMcode CVar4;
  Curl_llist_node *n;
  Curl_easy *pCVar5;
  Curl_tree *pCVar6;
  curltime cVar7;
  curltime now_00;
  _Bool stream_unused;
  Curl_tree *t;
  curltime now;
  CURLcode result_unused;
  sigpipe_ignore pipe_st;
  _Bool local_f9;
  Curl_tree *local_f8;
  curltime local_f0;
  uint *local_e0;
  CURLcode local_d4;
  sigpipe_ignore local_d0;
  
  local_f8 = (Curl_tree *)0x0;
  cVar7 = Curl_now();
  local_f0.tv_sec = cVar7.tv_sec;
  local_f0.tv_usec = cVar7.tv_usec;
  CVar4 = CURLM_BAD_HANDLE;
  if (((multi != (Curl_multi *)0x0) && (multi->magic == 0xbab1e)) &&
     (CVar4 = CURLM_RECURSIVE_API_CALL, (multi->field_0x279 & 4) == 0)) {
    CVar4 = CURLM_OK;
    local_e0 = (uint *)running_handles;
    memset(&local_d0,0,0xa0);
    local_d0.no_signal = true;
    n = Curl_llist_head(&multi->process);
    if (n != (Curl_llist_node *)0x0) {
      CVar4 = CURLM_OK;
      do {
        pCVar5 = (Curl_easy *)Curl_node_elem(n);
        n = Curl_node_next(n);
        if (pCVar5 != (multi->cpool).idata) {
          sigpipe_apply(pCVar5,&local_d0);
          CVar3 = multi_runsingle(multi,&local_f0,pCVar5);
          if (CVar3 != CURLM_OK) {
            CVar4 = CVar3;
          }
        }
      } while (n != (Curl_llist_node *)0x0);
    }
    sigpipe_apply((multi->cpool).idata,&local_d0);
    Curl_cpool_multi_perform(multi);
    if (local_d0.no_signal == false) {
      sigaction(0xd,(sigaction *)&local_d0,(sigaction *)0x0);
    }
    do {
      cVar7.tv_usec = local_f0.tv_usec;
      cVar7.tv_sec = local_f0.tv_sec;
      cVar7._12_4_ = 0;
      pCVar6 = Curl_splaygetbest(cVar7,multi->timetree,&local_f8);
      multi->timetree = pCVar6;
      if (local_f8 == (Curl_tree *)0x0) break;
      pCVar5 = (Curl_easy *)Curl_splayget(local_f8);
      if (pCVar5->mstate == MSTATE_PENDING) {
        _Var2 = multi_handle_timeout(pCVar5,&local_f0,&local_f9,&local_d4);
        if (_Var2) {
          if ((((pCVar5->set).field_0x8cd & 0x10) != 0) &&
             ((pcVar1 = (pCVar5->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
              (0 < pcVar1->log_level)))) {
            Curl_infof(pCVar5,"PENDING handle timeout");
          }
          move_pending_to_connect(multi,pCVar5);
        }
      }
      pCVar5 = (Curl_easy *)Curl_splayget(local_f8);
      now_00.tv_usec = local_f0.tv_usec;
      now_00.tv_sec = local_f0.tv_sec;
      now_00._12_4_ = 0;
      add_next_timeout(now_00,multi,pCVar5);
    } while (local_f8 != (Curl_tree *)0x0);
    if (local_e0 != (uint *)0x0) {
      *local_e0 = multi->num_alive;
    }
    if (CVar4 < CURLM_BAD_HANDLE) {
      CVar4 = Curl_update_timer(multi);
    }
  }
  return CVar4;
}

Assistant:

CURLMcode curl_multi_perform(struct Curl_multi *multi, int *running_handles)
{
  CURLMcode returncode = CURLM_OK;
  struct Curl_tree *t = NULL;
  struct curltime now = Curl_now();
  struct Curl_llist_node *e;
  struct Curl_llist_node *n = NULL;
  SIGPIPE_VARIABLE(pipe_st);

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  sigpipe_init(&pipe_st);
  for(e = Curl_llist_head(&multi->process); e; e = n) {
    struct Curl_easy *data = Curl_node_elem(e);
    CURLMcode result;
    /* Do the loop and only alter the signal ignore state if the next handle
       has a different NO_SIGNAL state than the previous */

    /* the current node might be unlinked in multi_runsingle(), get the next
       pointer now */
    n = Curl_node_next(e);

    if(data != multi->cpool.idata) {
      /* connection pool handle is processed below */
      sigpipe_apply(data, &pipe_st);
      result = multi_runsingle(multi, &now, data);
      if(result)
        returncode = result;
    }
  }

  sigpipe_apply(multi->cpool.idata, &pipe_st);
  Curl_cpool_multi_perform(multi);

  sigpipe_restore(&pipe_st);

  /*
   * Simply remove all expired timers from the splay since handles are dealt
   * with unconditionally by this function and curl_multi_timeout() requires
   * that already passed/handled expire times are removed from the splay.
   *
   * It is important that the 'now' value is set at the entry of this function
   * and not for the current time as it may have ticked a little while since
   * then and then we risk this loop to remove timers that actually have not
   * been handled!
   */
  do {
    multi->timetree = Curl_splaygetbest(now, multi->timetree, &t);
    if(t) {
      /* the removed may have another timeout in queue */
      struct Curl_easy *data = Curl_splayget(t);
      if(data->mstate == MSTATE_PENDING) {
        bool stream_unused;
        CURLcode result_unused;
        if(multi_handle_timeout(data, &now, &stream_unused, &result_unused)) {
          infof(data, "PENDING handle timeout");
          move_pending_to_connect(multi, data);
        }
      }
      (void)add_next_timeout(now, multi, Curl_splayget(t));
    }
  } while(t);

  if(running_handles)
    *running_handles = (int)multi->num_alive;

  if(CURLM_OK >= returncode)
    returncode = Curl_update_timer(multi);

  return returncode;
}